

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4a5d0d::CCoinsViewTest::GetCoin
          (CCoinsViewTest *this,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::find(&(this->map_)._M_t,outpoint);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->map_)._M_t._M_impl.super__Rb_tree_header) {
LAB_002ba2c5:
    bVar2 = false;
  }
  else {
    Coin::operator=(coin,(Coin *)&cVar3._M_node[2]._M_parent);
    if ((coin->out).nValue == -1) {
      bVar2 = RandomMixin<FastRandomContext>::randbool
                        (&this->m_rng->super_RandomMixin<FastRandomContext>);
      if (!bVar2) goto LAB_002ba2c5;
    }
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] bool GetCoin(const COutPoint& outpoint, Coin& coin) const override
    {
        std::map<COutPoint, Coin>::const_iterator it = map_.find(outpoint);
        if (it == map_.end()) {
            return false;
        }
        coin = it->second;
        if (coin.IsSpent() && m_rng.randbool() == 0) {
            // Randomly return false in case of an empty entry.
            return false;
        }
        return true;
    }